

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O3

void __thiscall
PersistentStorageJsonTestSuite_LookupNetwork_Test::TestBody
          (PersistentStorageJsonTestSuite_LookupNetwork_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppNVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 *puVar6;
  size_type sVar7;
  Status SVar8;
  char *in_R9;
  char *pcVar9;
  bool bVar10;
  AssertHelper local_140;
  undefined8 *local_138;
  AssertHelper local_130;
  AssertHelper local_128;
  string local_120;
  NetworkId newId;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  retLookup;
  Network net;
  PersistentStorageJson psj;
  
  unlink("./tmp/test.tmp");
  psVar3 = &net.mName._M_string_length;
  net._0_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&net,"./tmp/test.tmp","");
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&psj,(string *)&net);
  if ((size_type *)net._0_8_ != psVar3) {
    operator_delete((void *)net._0_8_);
  }
  SVar8 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&psj);
  local_120._M_dataplus._M_p._0_1_ = SVar8 == kSuccess;
  local_120._M_string_length = 0;
  if (SVar8 != kSuccess) {
    testing::Message::Message((Message *)&retLookup);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_120,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x28d,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&retLookup);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if (retLookup.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)retLookup.
                            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    sVar7 = local_120._M_string_length;
    if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_120._M_string_length !=
          (undefined8 *)(local_120._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_120._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&newId);
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_130,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_128,0xffffffff);
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"nwk1","");
  ppNVar2 = &retLookup.
             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  retLookup.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppNVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&retLookup,"2000:aaa1::0/8","");
  pcVar9 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            (&net,(NetworkId *)&local_130,(DomainId *)&local_128,&local_120,0xfffffffffffffff1,0xb,
             0xfff1,(string *)&retLookup,1);
  SVar8 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&net,&newId);
  local_140.data_._0_1_ = (internal)(SVar8 == kSuccess);
  local_138 = (undefined8 *)0x0;
  paVar4 = &net.mMlp.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mMlp._M_dataplus._M_p != paVar4) {
    operator_delete(net.mMlp._M_dataplus._M_p);
  }
  paVar5 = &net.mName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mName._M_dataplus._M_p != paVar5) {
    operator_delete(net.mName._M_dataplus._M_p);
  }
  if (retLookup.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppNVar2) {
    operator_delete(retLookup.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_140.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_140,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk1\", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, \"2000:aaa1::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&retLookup,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x292,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&retLookup,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&retLookup);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_120._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_138;
  if (local_138 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_138 != local_138 + 2) {
      operator_delete((undefined8 *)*local_138);
    }
    operator_delete(puVar6);
  }
  local_120._M_dataplus._M_p._0_1_ = newId.mId == 0;
  local_120._M_string_length = 0;
  if (newId.mId != 0) {
    testing::Message::Message((Message *)&retLookup);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_120,(AssertionResult *)"newId.mId == 0","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x293,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&retLookup);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if (retLookup.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)retLookup.
                            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    sVar7 = local_120._M_string_length;
    if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_120._M_string_length !=
          (undefined8 *)(local_120._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_120._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_130,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_128,0xffffffff);
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"nwk2","");
  retLookup.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppNVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&retLookup,"2000:aaa2::0/8","");
  pcVar9 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            (&net,(NetworkId *)&local_130,(DomainId *)&local_128,&local_120,0xfffffffffffffff2,0xb,
             0xfff2,(string *)&retLookup,1);
  SVar8 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&net,&newId);
  local_140.data_._0_1_ = (internal)(SVar8 == kSuccess);
  local_138 = (undefined8 *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mMlp._M_dataplus._M_p != paVar4) {
    operator_delete(net.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mName._M_dataplus._M_p != paVar5) {
    operator_delete(net.mName._M_dataplus._M_p);
  }
  if (retLookup.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppNVar2) {
    operator_delete(retLookup.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_140.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_140,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk2\", 0xFFFFFFFFFFFFFFF2ll, 11, 0xFFF2, \"2000:aaa2::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&retLookup,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x295,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&retLookup,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&retLookup);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_120._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_138;
  if (local_138 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_138 != local_138 + 2) {
      operator_delete((undefined8 *)*local_138);
    }
    operator_delete(puVar6);
  }
  local_120._M_dataplus._M_p._0_1_ = newId.mId == 1;
  local_120._M_string_length = 0;
  if (newId.mId != 1) {
    testing::Message::Message((Message *)&retLookup);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_120,(AssertionResult *)"newId.mId == 1","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x296,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&retLookup);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if (retLookup.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)retLookup.
                            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    sVar7 = local_120._M_string_length;
    if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_120._M_string_length !=
          (undefined8 *)(local_120._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_120._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_130,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_128,0xffffffff);
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"nwk3","");
  retLookup.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppNVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&retLookup,"2000:aaa3::0/8","");
  pcVar9 = (char *)0xb;
  ot::commissioner::persistent_storage::Network::Network
            (&net,(NetworkId *)&local_130,(DomainId *)&local_128,&local_120,0xfffffffffffffff3,0xb,
             0xfff3,(string *)&retLookup,1);
  SVar8 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&net,&newId);
  local_140.data_._0_1_ = (internal)(SVar8 == kSuccess);
  local_138 = (undefined8 *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mMlp._M_dataplus._M_p != paVar4) {
    operator_delete(net.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mName._M_dataplus._M_p != paVar5) {
    operator_delete(net.mName._M_dataplus._M_p);
  }
  if (retLookup.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppNVar2) {
    operator_delete(retLookup.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_140.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_140,
               (AssertionResult *)
               "psj.Add(Network{EMPTY_ID, EMPTY_ID, \"nwk3\", 0xFFFFFFFFFFFFFFF3ll, 11, 0xFFF3, \"2000:aaa3::0/8\", 1}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&retLookup,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x298,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&retLookup,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&retLookup);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_120._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_138;
  if (local_138 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_138 != local_138 + 2) {
      operator_delete((undefined8 *)*local_138);
    }
    operator_delete(puVar6);
  }
  bVar10 = newId.mId == 2;
  local_120._M_string_length = 0;
  local_120._M_dataplus._M_p._0_1_ = bVar10;
  if (!bVar10) {
    testing::Message::Message((Message *)&retLookup);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_120,(AssertionResult *)"newId.mId == 2","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x299,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&retLookup);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if (retLookup.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)retLookup.
                            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                            ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
    sVar7 = local_120._M_string_length;
    if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_120._M_string_length !=
          (undefined8 *)(local_120._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_120._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  retLookup.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  retLookup.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  retLookup.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ot::commissioner::persistent_storage::Network::Network(&net);
  SVar8 = ot::commissioner::persistent_storage::PersistentStorageJson::Lookup(&psj,&net,&retLookup);
  local_120._M_dataplus._M_p._0_1_ = SVar8 == kSuccess;
  local_120._M_string_length = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mMlp._M_dataplus._M_p != paVar4) {
    operator_delete(net.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mName._M_dataplus._M_p != paVar5) {
    operator_delete(net.mName._M_dataplus._M_p);
  }
  if ((char)local_120._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_120,
               (AssertionResult *)
               "psj.Lookup(Network{}, retLookup) == PersistentStorage::Status::kSuccess","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x29e,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if ((long *)CONCAT71(local_140.data_._1_7_,local_140.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_140.data_._1_7_,local_140.data_._0_1_) + 8))();
    }
  }
  sVar7 = local_120._M_string_length;
  if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_120._M_string_length !=
        (undefined8 *)(local_120._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_120._M_string_length);
    }
    operator_delete((void *)sVar7);
  }
  bVar10 = (long)retLookup.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)retLookup.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x120;
  local_120._M_dataplus._M_p._0_1_ = bVar10;
  local_120._M_string_length = 0;
  if (!bVar10) {
    testing::Message::Message((Message *)&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&net,(internal *)&local_120,(AssertionResult *)"retLookup.size() == 3",
               "false","true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x29f,(char *)net._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((size_type *)net._0_8_ != psVar3) {
      operator_delete((void *)net._0_8_);
    }
    if ((long *)CONCAT71(local_140.data_._1_7_,local_140.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_140.data_._1_7_,local_140.data_._0_1_) + 8))();
    }
    sVar7 = local_120._M_string_length;
    if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_120._M_string_length !=
          (undefined8 *)(local_120._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_120._M_string_length);
      }
      operator_delete((void *)sVar7);
    }
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::_M_erase_at_end(&retLookup,
                    retLookup.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  ot::commissioner::persistent_storage::Network::Network(&net);
  std::__cxx11::string::_M_replace((ulong)&net.mName,0,(char *)net.mName._M_string_length,0x23d55f);
  net.mCcm = 1;
  SVar8 = ot::commissioner::persistent_storage::PersistentStorageJson::Lookup(&psj,&net,&retLookup);
  local_140.data_._0_1_ = (internal)(SVar8 == kSuccess);
  local_138 = (undefined8 *)0x0;
  if (!(bool)local_140.data_._0_1_) {
    testing::Message::Message((Message *)&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_140,
               (AssertionResult *)
               "psj.Lookup(net, retLookup) == PersistentStorage::Status::kSuccess","false","true",
               pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x2a6,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_130.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_130.data_ + 8))();
    }
    puVar6 = local_138;
    if (local_138 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_138 != local_138 + 2) {
        operator_delete((undefined8 *)*local_138);
      }
      operator_delete(puVar6);
    }
  }
  local_140.data_._0_1_ =
       (internal)
       ((long)retLookup.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)retLookup.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60);
  local_138 = (undefined8 *)0x0;
  if (!(bool)local_140.data_._0_1_) {
    testing::Message::Message((Message *)&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_140,(AssertionResult *)"retLookup.size() == 1","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x2a7,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_130.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_130.data_ + 8))();
    }
    puVar6 = local_138;
    if (local_138 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_138 != local_138 + 2) {
        operator_delete((undefined8 *)*local_138);
      }
      operator_delete(puVar6);
    }
  }
  SVar8 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&psj);
  local_140.data_._0_1_ = (internal)(SVar8 == kSuccess);
  local_138 = (undefined8 *)0x0;
  if (!(bool)local_140.data_._0_1_) {
    testing::Message::Message((Message *)&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_140,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x2a9,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_130.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_130.data_ + 8))();
    }
    puVar6 = local_138;
    if (local_138 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_138 != local_138 + 2) {
        operator_delete((undefined8 *)*local_138);
      }
      operator_delete(puVar6);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mMlp._M_dataplus._M_p != paVar4) {
    operator_delete(net.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)net.mName._M_dataplus._M_p != paVar5) {
    operator_delete(net.mName._M_dataplus._M_p);
  }
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&retLookup);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&psj);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, LookupNetwork)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    // Populate storage with initial data
    NetworkId newId;
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk1", 0xFFFFFFFFFFFFFFF1ll, 11, 0xFFF1, "2000:aaa1::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk2", 0xFFFFFFFFFFFFFFF2ll, 11, 0xFFF2, "2000:aaa2::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Network{EMPTY_ID, EMPTY_ID, "nwk3", 0xFFFFFFFFFFFFFFF3ll, 11, 0xFFF3, "2000:aaa3::0/8", 1},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    // The test
    std::vector<Network> retLookup;

    EXPECT_TRUE(psj.Lookup(Network{}, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 3);

    retLookup.clear();

    Network net;
    net.mName = "nwk1";
    net.mCcm  = true;
    EXPECT_TRUE(psj.Lookup(net, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 1);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}